

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterBuilder.cpp
# Opt level: O0

void __thiscall
slang::ast::ParameterBuilder::ParameterBuilder
          (ParameterBuilder *this,Scope *scope,string_view definitionName,
          span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>
          parameterDecls)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
  *in_R8;
  undefined8 in_R9;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[2] = in_RCX;
  in_RDI[3] = in_R8;
  in_RDI[4] = in_R9;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::SmallMap(in_R8);
  in_RDI[0x2e] = 0;
  in_RDI[0x2f] = 0;
  in_RDI[0x30] = 0;
  *(undefined1 *)(in_RDI + 0x31) = 0;
  *(undefined1 *)((long)in_RDI + 0x189) = 0;
  *(undefined1 *)((long)in_RDI + 0x18a) = 0;
  return;
}

Assistant:

ParameterBuilder::ParameterBuilder(const Scope& scope, std::string_view definitionName,
                                   std::span<const Decl> parameterDecls) :
    scope(scope), definitionName(definitionName), parameterDecls(parameterDecls) {
}